

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void utf8_suite::test_20(void)

{
  char input [4];
  decoder_type decoder;
  value_type local_178 [4];
  undefined4 local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_decoder<char> local_150;
  
  local_150.input.tail = local_178 + 3;
  builtin_memcpy(local_178,"\" \"",4);
  local_150.input.head = local_178;
  memset(&local_150.current,0,0x120);
  local_150.current.code = uninitialized;
  local_150.current.view.head = (const_pointer)0x0;
  local_150.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_150);
  local_170._M_dataplus._M_p._0_4_ = local_150.current.code;
  local_174 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x768,"void utf8_suite::test_20()",&local_170,&local_174);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_170,&local_150);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.string_value<std::string>()","\"\\x20\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x769,"void utf8_suite::test_20()",&local_170," ");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_170._M_dataplus._M_p._4_4_,(value)local_170._M_dataplus._M_p) !=
      &local_170.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_170._M_dataplus._M_p._4_4_,(value)local_170._M_dataplus._M_p),
                    local_170.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}